

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInterval.cpp
# Opt level: O0

void anon_unknown.dwarf_5b268::testHasVolume<int>(char *type)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RDI;
  Interval<int> b_2;
  int max;
  int min;
  Interval<int> b1;
  int p1;
  int p0;
  Interval<int> b0;
  Interval<int> b_1;
  Interval<int> b;
  Interval<int> IStack_48;
  int in_stack_ffffffffffffffc0;
  int iVar3;
  int in_stack_ffffffffffffffc4;
  int iVar4;
  Interval<int> local_38;
  int local_30 [4];
  Interval<int> local_20;
  Interval<int> local_18;
  Interval<int> local_10;
  char *local_8;
  
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"    hasVolume() for type ");
  poVar2 = std::operator<<(poVar2,local_8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Interval<int>::Interval((Interval<int> *)0x16fcf2);
  bVar1 = Imath_3_2::Interval<int>::hasVolume(&local_10);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x27f,"void (anonymous namespace)::testHasVolume(const char *) [T = int]");
  }
  Imath_3_2::Interval<int>::Interval((Interval<int> *)0x16fd2f);
  Imath_3_2::Interval<int>::makeInfinite
            ((Interval<int> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  bVar1 = Imath_3_2::Interval<int>::hasVolume(&local_18);
  if (!bVar1) {
    __assert_fail("b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x288,"void (anonymous namespace)::testHasVolume(const char *) [T = int]");
  }
  local_30[3] = 0xffffffff;
  local_30[2] = 1;
  Imath_3_2::Interval<int>::Interval(&local_20,local_30 + 3,local_30 + 2);
  bVar1 = Imath_3_2::Interval<int>::hasVolume(&local_20);
  if (!bVar1) {
    __assert_fail("b0.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x290,"void (anonymous namespace)::testHasVolume(const char *) [T = int]");
  }
  local_30[1] = 2;
  local_30[0] = 4;
  Imath_3_2::Interval<int>::Interval(&local_38,local_30 + 1,local_30);
  bVar1 = Imath_3_2::Interval<int>::hasVolume(&local_38);
  if (!bVar1) {
    __assert_fail("b1.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x296,"void (anonymous namespace)::testHasVolume(const char *) [T = int]");
  }
  iVar4 = 0;
  iVar3 = 2;
  Imath_3_2::Interval<int>::Interval
            (&IStack_48,(int *)&stack0xffffffffffffffc4,(int *)&stack0xffffffffffffffc0);
  Imath_3_2::Interval<int>::makeEmpty((Interval<int> *)CONCAT44(iVar4,iVar3));
  bVar1 = Imath_3_2::Interval<int>::hasVolume(&IStack_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testInterval.cpp"
                  ,0x2a2,"void (anonymous namespace)::testHasVolume(const char *) [T = int]");
  }
  return;
}

Assistant:

void
testHasVolume (const char* type)
{
    cout << "    hasVolume() for type " << type << endl;

    //
    // Empty interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        assert (!b.hasVolume ());
    }

    //
    // Infinite interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b;
        b.makeInfinite ();
        assert (b.hasVolume ());
    }

    //
    // Non-empty, has-volume interval.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Interval<T> b0 (T (-1), T (1));
        assert (b0.hasVolume ());

        T p0 (2);
        T p1 (4);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b1 (p0, p1);
        assert (b1.hasVolume ());
    }

    //
    // Non-empty, no-volume interval.
    //
    {
        T min (0);
        T max (2);

        IMATH_INTERNAL_NAMESPACE::Interval<T> b (min, max);
        b.makeEmpty ();
        assert (!b.hasVolume ());
    }
}